

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdc-reader.cc
# Opt level: O0

bool __thiscall
tinyusdz::usdc::USDCReader::Impl::ReconstructPrimSpecRecursively
          (Impl *this,int parent,int current,PrimSpec *parentPrimSpec,int level,
          PathIndexToSpecIndexMap *psmap,Layer *layer)

{
  int parent_00;
  bool bVar1;
  ostream *poVar2;
  size_type sVar3;
  size_type sVar4;
  reference this_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_01;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_02;
  const_reference pvVar5;
  size_type sVar6;
  mapped_type *this_03;
  string *psVar7;
  size_type sVar8;
  type *this_04;
  type *ptVar9;
  PropertyMap *this_05;
  mapped_type *this_06;
  mapped_type *pmVar10;
  reference piVar11;
  string *psVar12;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>_>_>
  *pmVar13;
  mapped_type *pmVar14;
  ulong uVar15;
  PrimMeta *pPVar16;
  mapped_type *pmVar17;
  PrimMeta *this_07;
  vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_> *__x;
  value_type *pvVar18;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>_>
  *this_08;
  value_type *this_09;
  mapped_type *this_10;
  size_type sVar19;
  mapped_type *pmVar20;
  vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_> *pvVar21;
  PrimSpec *vps;
  ostringstream local_2078 [8];
  ostringstream ss_w;
  VariantSetSpec *vs_1;
  string variantName_1;
  string variantSetName_1;
  ostringstream local_1e98 [8];
  ostringstream ss_e_10;
  undefined1 local_1d20 [8];
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL> toks_1
  ;
  ostringstream local_1cc0 [8];
  ostringstream ss_e_9;
  PrimSpec *vp;
  ostringstream local_1b20 [8];
  ostringstream ss_e_8;
  int *item_1;
  iterator __end3_1;
  iterator __begin3_1;
  mapped_type *__range3_1;
  ostringstream local_1968 [8];
  ostringstream ss_e_7;
  VariantSetSpec *vs;
  string prop_name;
  pair<tinyusdz::Path,_tinyusdz::Property> *pp;
  ostringstream local_17a0 [8];
  ostringstream ss_e_6;
  int *item;
  iterator __end3;
  iterator __begin3;
  mapped_type *__range3;
  PrimSpec variant;
  string variantName;
  string variantSetName;
  ostringstream local_1040 [8];
  ostringstream ss_e_5;
  undefined1 local_ec8 [8];
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL> toks;
  ostringstream local_e68 [8];
  ostringstream ss_e_4;
  Prim *variantPrim;
  ostringstream local_cc8 [8];
  ostringstream ss_e_3;
  string local_b50;
  ostringstream local_b30 [8];
  ostringstream ss_e_2;
  ulong local_9b8;
  size_t i;
  Node *node;
  undefined1 local_9a0 [7];
  bool is_parent_variant;
  optional<tinyusdz::PrimSpec> primspec;
  PrimSpec *currPrimSpecPtr;
  __cxx11 local_408 [32];
  string local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  ostringstream local_348 [8];
  ostringstream ss_e_1;
  string local_1d0;
  ostringstream local_1b0 [8];
  ostringstream ss_e;
  PathIndexToSpecIndexMap *psmap_local;
  int level_local;
  PrimSpec *parentPrimSpec_local;
  int current_local;
  int parent_local;
  Impl *this_local;
  
  parentPrimSpec_local._0_4_ = current;
  parentPrimSpec_local._4_4_ = parent;
  _current_local = this;
  if ((int)(this->_config).kMaxPrimNestLevel < level) {
    ::std::__cxx11::ostringstream::ostringstream(local_1b0);
    poVar2 = ::std::operator<<((ostream *)local_1b0,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,"[USDC]");
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"ReconstructPrimSpecRecursively");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xdd0);
    ::std::operator<<(poVar2," ");
    poVar2 = ::std::operator<<((ostream *)local_1b0,"PrimSpec hierarchy is too deep.");
    ::std::operator<<(poVar2,"\n");
    ::std::__cxx11::ostringstream::str();
    PushError(this,&local_1d0);
    ::std::__cxx11::string::~string((string *)&local_1d0);
    this_local._7_1_ = 0;
    ::std::__cxx11::ostringstream::~ostringstream(local_1b0);
    goto LAB_001e1f13;
  }
  if ((current < 0) ||
     (sVar3 = ::std::
              vector<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
              ::size(&this->_nodes), (int)sVar3 <= current)) {
    ::std::__cxx11::ostringstream::ostringstream(local_348);
    poVar2 = ::std::operator<<((ostream *)local_348,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"ReconstructPrimSpecRecursively");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xdd9);
    ::std::operator<<(poVar2," ");
    ::std::__cxx11::to_string(&local_3e8,(int)parentPrimSpec_local);
    ::std::operator+((char *)&local_3c8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     "Invalid current node id: ");
    ::std::operator+(&local_3a8,&local_3c8,". Must be in range [0, ");
    sVar3 = ::std::
            vector<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
            ::size(&this->_nodes);
    std::__cxx11::to_string(local_408,sVar3);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_388
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_3a8);
    ::std::operator+(&local_368,&local_388,")");
    poVar2 = ::std::operator<<((ostream *)local_348,(string *)&local_368);
    ::std::operator<<(poVar2,"\n");
    ::std::__cxx11::string::~string((string *)&local_368);
    ::std::__cxx11::string::~string((string *)&local_388);
    ::std::__cxx11::string::~string((string *)local_408);
    ::std::__cxx11::string::~string((string *)&local_3a8);
    ::std::__cxx11::string::~string((string *)&local_3c8);
    ::std::__cxx11::string::~string((string *)&local_3e8);
    ::std::__cxx11::ostringstream::str();
    PushError(this,(string *)&currPrimSpecPtr);
    ::std::__cxx11::string::~string((string *)&currPrimSpecPtr);
    ::std::__cxx11::ostringstream::~ostringstream(local_348);
    this_local._7_1_ = 0;
    goto LAB_001e1f13;
  }
  primspec.contained._1376_8_ = 0;
  nonstd::optional_lite::optional<tinyusdz::PrimSpec>::optional
            ((optional<tinyusdz::PrimSpec> *)local_9a0);
  sVar4 = ::std::
          map<int,_tinyusdz::Prim,_std::less<int>,_std::allocator<std::pair<const_int,_tinyusdz::Prim>_>_>
          ::count(&this->_variantPrims,(key_type_conflict2 *)((long)&parentPrimSpec_local + 4));
  bVar1 = ReconstructPrimSpecNode
                    (this,parentPrimSpec_local._4_4_,(int)parentPrimSpec_local,level,sVar4 != 0,
                     psmap,layer,(optional<tinyusdz::PrimSpec> *)local_9a0);
  if (bVar1) {
    bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_9a0);
    if (bVar1) {
      primspec.contained._1376_8_ =
           nonstd::optional_lite::optional<tinyusdz::PrimSpec>::value
                     ((optional<tinyusdz::PrimSpec> *)local_9a0);
    }
    this_00 = ::std::
              vector<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
              ::operator[](&this->_nodes,(long)(int)parentPrimSpec_local);
    local_9b8 = 0;
    while( true ) {
      this_01 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                crate::CrateReader::Node::GetChildren(this_00);
      sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(this_01);
      parent_00 = (int)parentPrimSpec_local;
      if (sVar3 <= local_9b8) break;
      this_02 = crate::CrateReader::Node::GetChildren(this_00);
      pvVar5 = ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (this_02,local_9b8);
      bVar1 = ReconstructPrimSpecRecursively
                        (this,parent_00,(int)*pvVar5,(PrimSpec *)primspec.contained._1376_8_,
                         level + 1,psmap,layer);
      if (!bVar1) {
        this_local._7_1_ = 0;
        goto LAB_001e1f07;
      }
      local_9b8 = local_9b8 + 1;
    }
    sVar6 = ::std::
            map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
            ::count(&this->_variantPropChildren,(key_type_conflict2 *)&parentPrimSpec_local);
    if (sVar6 == 0) {
LAB_001e1694:
      sVar6 = ::std::
              map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
              ::count(&this->_variantPrimChildren,(key_type_conflict2 *)&parentPrimSpec_local);
      if (sVar6 != 0) {
        bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_9a0);
        if (!bVar1) {
          ::std::__cxx11::ostringstream::ostringstream(local_1968);
          poVar2 = ::std::operator<<((ostream *)local_1968,"[error]");
          poVar2 = ::std::operator<<(poVar2,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                    );
          poVar2 = ::std::operator<<(poVar2,":");
          poVar2 = ::std::operator<<(poVar2,"ReconstructPrimSpecRecursively");
          poVar2 = ::std::operator<<(poVar2,"():");
          poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xe49);
          ::std::operator<<(poVar2," ");
          poVar2 = ::std::operator<<((ostream *)local_1968,"Internal error: must be Prim.");
          ::std::operator<<(poVar2,"\n");
          ::std::__cxx11::ostringstream::str();
          PushError(this,(string *)&__range3_1);
          ::std::__cxx11::string::~string((string *)&__range3_1);
          this_local._7_1_ = 0;
          ::std::__cxx11::ostringstream::~ostringstream(local_1968);
          goto LAB_001e1f07;
        }
        pmVar10 = ::std::
                  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                  ::at(&this->_variantPrimChildren,(key_type_conflict2 *)&parentPrimSpec_local);
        __end3_1 = ::std::vector<int,_std::allocator<int>_>::begin(pmVar10);
        item_1 = (int *)::std::vector<int,_std::allocator<int>_>::end(pmVar10);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end3_1,
                                  (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                   *)&item_1), bVar1) {
          piVar11 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                    operator*(&__end3_1);
          sVar19 = ::std::
                   map<int,_tinyusdz::PrimSpec,_std::less<int>,_std::allocator<std::pair<const_int,_tinyusdz::PrimSpec>_>_>
                   ::count(&this->_variantPrimSpecs,piVar11);
          if (sVar19 == 0) {
            ::std::__cxx11::ostringstream::ostringstream(local_1b20);
            poVar2 = ::std::operator<<((ostream *)local_1b20,"[error]");
            poVar2 = ::std::operator<<(poVar2,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                      );
            poVar2 = ::std::operator<<(poVar2,":");
            poVar2 = ::std::operator<<(poVar2,"ReconstructPrimSpecRecursively");
            poVar2 = ::std::operator<<(poVar2,"():");
            poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xe52);
            ::std::operator<<(poVar2," ");
            poVar2 = ::std::operator<<((ostream *)local_1b20,
                                       "Internal error: variant Prim children not found.");
            ::std::operator<<(poVar2,"\n");
            ::std::__cxx11::ostringstream::str();
            PushError(this,(string *)&vp);
            ::std::__cxx11::string::~string((string *)&vp);
            this_local._7_1_ = 0;
            ::std::__cxx11::ostringstream::~ostringstream(local_1b20);
            goto LAB_001e1f07;
          }
          pmVar20 = ::std::
                    map<int,_tinyusdz::PrimSpec,_std::less<int>,_std::allocator<std::pair<const_int,_tinyusdz::PrimSpec>_>_>
                    ::at(&this->_variantPrimSpecs,piVar11);
          psVar7 = PrimSpec::name_abi_cxx11_(pmVar20);
          bVar1 = is_variantElementName(psVar7);
          if (!bVar1) {
            ::std::__cxx11::ostringstream::ostringstream(local_1cc0);
            poVar2 = ::std::operator<<((ostream *)local_1cc0,"[error]");
            poVar2 = ::std::operator<<(poVar2,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                      );
            poVar2 = ::std::operator<<(poVar2,":");
            poVar2 = ::std::operator<<(poVar2,"ReconstructPrimSpecRecursively");
            poVar2 = ::std::operator<<(poVar2,"():");
            poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xe5b);
            ::std::operator<<(poVar2," ");
            poVar2 = ::std::operator<<((ostream *)local_1cc0,
                                       "Corrupted Crate. Variant Prim has invalid element_name.");
            ::std::operator<<(poVar2,"\n");
            ::std::__cxx11::ostringstream::str();
            PushError(this,(string *)&toks_1.field_0x38);
            ::std::__cxx11::string::~string((string *)&toks_1.field_0x38);
            this_local._7_1_ = 0;
            ::std::__cxx11::ostringstream::~ostringstream(local_1cc0);
            goto LAB_001e1f07;
          }
          ::std::
          array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
          ::array((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
                   *)local_1d20);
          psVar7 = PrimSpec::name_abi_cxx11_(pmVar20);
          bVar1 = tokenize_variantElement
                            (psVar7,(array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>_conflict
                                     *)local_1d20);
          if (bVar1) {
            psVar12 = (string *)
                      ::std::
                      array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
                      ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
                                    *)local_1d20,0);
            ::std::__cxx11::string::string
                      ((string *)(variantName_1.field_2._M_local_buf + 8),psVar12);
            psVar12 = (string *)
                      ::std::
                      array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
                      ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
                                    *)local_1d20,1);
            ::std::__cxx11::string::string((string *)&vs_1,psVar12);
            pvVar18 = nonstd::optional_lite::optional<tinyusdz::PrimSpec>::operator->
                                ((optional<tinyusdz::PrimSpec> *)local_9a0);
            pmVar13 = PrimSpec::variantSets_abi_cxx11_(pvVar18);
            pmVar14 = ::std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>_>_>
                      ::operator[](pmVar13,(key_type *)((long)&variantName_1.field_2 + 8));
            uVar15 = ::std::__cxx11::string::empty();
            if ((uVar15 & 1) != 0) {
              ::std::__cxx11::string::operator=
                        ((string *)pmVar14,(string *)(variantName_1.field_2._M_local_buf + 8));
            }
            pPVar16 = PrimSpec::metas(pmVar20);
            pmVar17 = ::std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>_>
                      ::operator[](&pmVar14->variantSet,(key_type *)&vs_1);
            this_07 = PrimSpec::metas(pmVar17);
            PrimMetas::operator=(this_07,pPVar16);
            __x = PrimSpec::children(pmVar20);
            pmVar17 = ::std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>_>
                      ::operator[](&pmVar14->variantSet,(key_type *)&vs_1);
            pvVar21 = PrimSpec::children(pmVar17);
            ::std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>::operator=
                      ((vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_> *)pvVar21,
                       __x);
            ::std::__cxx11::string::~string((string *)&vs_1);
            ::std::__cxx11::string::~string((string *)(variantName_1.field_2._M_local_buf + 8));
            bVar1 = false;
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream(local_1e98);
            poVar2 = ::std::operator<<((ostream *)local_1e98,"[error]");
            poVar2 = ::std::operator<<(poVar2,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                      );
            poVar2 = ::std::operator<<(poVar2,":");
            poVar2 = ::std::operator<<(poVar2,"ReconstructPrimSpecRecursively");
            poVar2 = ::std::operator<<(poVar2,"():");
            poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xe60);
            ::std::operator<<(poVar2," ");
            poVar2 = ::std::operator<<((ostream *)local_1e98,"Invalid variant element_name.");
            ::std::operator<<(poVar2,"\n");
            ::std::__cxx11::ostringstream::str();
            PushError(this,(string *)((long)&variantSetName_1.field_2 + 8));
            ::std::__cxx11::string::~string((string *)(variantSetName_1.field_2._M_local_buf + 8));
            this_local._7_1_ = 0;
            bVar1 = true;
            ::std::__cxx11::ostringstream::~ostringstream(local_1e98);
          }
          ::std::
          array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
          ::~array((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
                    *)local_1d20);
          if (bVar1) goto LAB_001e1f07;
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&__end3_1);
        }
      }
      if (parentPrimSpec_local._4_4_ == 0) {
        bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_9a0);
        if (bVar1) {
          pvVar18 = nonstd::optional_lite::optional<tinyusdz::PrimSpec>::value
                              ((optional<tinyusdz::PrimSpec> *)local_9a0);
          this_08 = Layer::primspecs_abi_cxx11_(layer);
          this_09 = nonstd::optional_lite::optional<tinyusdz::PrimSpec>::value
                              ((optional<tinyusdz::PrimSpec> *)local_9a0);
          psVar7 = PrimSpec::name_abi_cxx11_(this_09);
          this_10 = ::std::
                    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>_>
                    ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>_>
                                  *)this_08,(key_type *)psVar7);
          PrimSpec::operator=(this_10,pvVar18);
        }
      }
      else {
        sVar19 = ::std::
                 map<int,_tinyusdz::PrimSpec,_std::less<int>,_std::allocator<std::pair<const_int,_tinyusdz::PrimSpec>_>_>
                 ::count(&this->_variantPrimSpecs,
                         (key_type_conflict2 *)((long)&parentPrimSpec_local + 4));
        if (sVar19 == 0) {
          bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_9a0);
          if ((bVar1) && (parentPrimSpec != (PrimSpec *)0x0)) {
            pvVar21 = PrimSpec::children(parentPrimSpec);
            pvVar18 = nonstd::optional_lite::optional<tinyusdz::PrimSpec>::value
                                ((optional<tinyusdz::PrimSpec> *)local_9a0);
            ::std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>::
            emplace_back<tinyusdz::PrimSpec>
                      ((vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_> *)pvVar21,
                       pvVar18);
          }
        }
        else {
          bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_9a0);
          if (bVar1) {
            pmVar20 = ::std::
                      map<int,_tinyusdz::PrimSpec,_std::less<int>,_std::allocator<std::pair<const_int,_tinyusdz::PrimSpec>_>_>
                      ::at(&this->_variantPrimSpecs,
                           (key_type_conflict2 *)((long)&parentPrimSpec_local + 4));
            pvVar21 = PrimSpec::children(pmVar20);
            pvVar18 = nonstd::optional_lite::optional<tinyusdz::PrimSpec>::value
                                ((optional<tinyusdz::PrimSpec> *)local_9a0);
            ::std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>::
            emplace_back<tinyusdz::PrimSpec>
                      ((vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_> *)pvVar21,
                       pvVar18);
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream(local_2078);
            poVar2 = ::std::operator<<((ostream *)local_2078,"[warn]");
            poVar2 = ::std::operator<<(poVar2,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                      );
            poVar2 = ::std::operator<<(poVar2,":");
            poVar2 = ::std::operator<<(poVar2,"ReconstructPrimSpecRecursively");
            poVar2 = ::std::operator<<(poVar2,"():");
            poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xe7c);
            ::std::operator<<(poVar2," ");
            poVar2 = ::std::operator<<((ostream *)local_2078,
                                       "parent is variantPrim, but current is not Prim.");
            ::std::operator<<(poVar2,"\n");
            ::std::__cxx11::ostringstream::str();
            PushWarn(this,(string *)&vps);
            ::std::__cxx11::string::~string((string *)&vps);
            ::std::__cxx11::ostringstream::~ostringstream(local_2078);
          }
        }
      }
      this_local._7_1_ = 1;
    }
    else {
      sVar4 = ::std::
              map<int,_tinyusdz::Prim,_std::less<int>,_std::allocator<std::pair<const_int,_tinyusdz::Prim>_>_>
              ::count(&this->_variantPrims,(key_type_conflict2 *)&parentPrimSpec_local);
      if (sVar4 == 0) {
        ::std::__cxx11::ostringstream::ostringstream(local_b30);
        poVar2 = ::std::operator<<((ostream *)local_b30,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ReconstructPrimSpecRecursively");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xe12);
        ::std::operator<<(poVar2," ");
        poVar2 = ::std::operator<<((ostream *)local_b30,
                                   "Internal error: variant attribute is not a child of VariantPrim."
                                  );
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::ostringstream::str();
        PushError(this,&local_b50);
        ::std::__cxx11::string::~string((string *)&local_b50);
        this_local._7_1_ = 0;
        ::std::__cxx11::ostringstream::~ostringstream(local_b30);
      }
      else if (parentPrimSpec == (PrimSpec *)0x0) {
        ::std::__cxx11::ostringstream::ostringstream(local_cc8);
        poVar2 = ::std::operator<<((ostream *)local_cc8,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ReconstructPrimSpecRecursively");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xe16);
        ::std::operator<<(poVar2," ");
        poVar2 = ::std::operator<<((ostream *)local_cc8,
                                   "Internal error: parentPrimSpec should exist.");
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::ostringstream::str();
        PushError(this,(string *)&variantPrim);
        ::std::__cxx11::string::~string((string *)&variantPrim);
        this_local._7_1_ = 0;
        ::std::__cxx11::ostringstream::~ostringstream(local_cc8);
      }
      else {
        this_03 = ::std::
                  map<int,_tinyusdz::Prim,_std::less<int>,_std::allocator<std::pair<const_int,_tinyusdz::Prim>_>_>
                  ::at(&this->_variantPrims,(key_type_conflict2 *)&parentPrimSpec_local);
        psVar7 = Prim::element_name_abi_cxx11_(this_03);
        bVar1 = is_variantElementName(psVar7);
        if (bVar1) {
          ::std::
          array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
          ::array((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
                   *)local_ec8);
          psVar7 = Prim::element_name_abi_cxx11_(this_03);
          bVar1 = tokenize_variantElement
                            (psVar7,(array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>_conflict
                                     *)local_ec8);
          if (bVar1) {
            psVar12 = (string *)
                      ::std::
                      array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
                      ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
                                    *)local_ec8,0);
            ::std::__cxx11::string::string((string *)(variantName.field_2._M_local_buf + 8),psVar12)
            ;
            psVar12 = (string *)
                      ::std::
                      array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
                      ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
                                    *)local_ec8,1);
            ::std::__cxx11::string::string
                      ((string *)
                       &variant._asset_search_paths.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,psVar12);
            PrimSpec::PrimSpec((PrimSpec *)&__range3);
            pmVar10 = ::std::
                      map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                      ::at(&this->_variantPropChildren,(key_type_conflict2 *)&parentPrimSpec_local);
            __end3 = ::std::vector<int,_std::allocator<int>_>::begin(pmVar10);
            item = (int *)::std::vector<int,_std::allocator<int>_>::end(pmVar10);
            while (bVar1 = __gnu_cxx::operator!=
                                     (&__end3,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                               *)&item), bVar1) {
              piVar11 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                        ::operator*(&__end3);
              sVar8 = ::std::
                      map<int,_std::pair<tinyusdz::Path,_tinyusdz::Property>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<tinyusdz::Path,_tinyusdz::Property>_>_>_>
                      ::count(&this->_variantProps,piVar11);
              if (sVar8 == 0) {
                ::std::__cxx11::ostringstream::ostringstream(local_17a0);
                poVar2 = ::std::operator<<((ostream *)local_17a0,"[error]");
                poVar2 = ::std::operator<<(poVar2,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                          );
                poVar2 = ::std::operator<<(poVar2,":");
                poVar2 = ::std::operator<<(poVar2,"ReconstructPrimSpecRecursively");
                poVar2 = ::std::operator<<(poVar2,"():");
                poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xe30);
                ::std::operator<<(poVar2," ");
                poVar2 = ::std::operator<<((ostream *)local_17a0,
                                           "Internal error: variant Property not found.");
                ::std::operator<<(poVar2,"\n");
                ::std::__cxx11::ostringstream::str();
                PushError(this,(string *)&pp);
                ::std::__cxx11::string::~string((string *)&pp);
                this_local._7_1_ = 0;
                bVar1 = true;
                ::std::__cxx11::ostringstream::~ostringstream(local_17a0);
                goto LAB_001e1652;
              }
              prop_name.field_2._8_8_ =
                   ::std::
                   map<int,_std::pair<tinyusdz::Path,_tinyusdz::Property>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<tinyusdz::Path,_tinyusdz::Property>_>_>_>
                   ::at(&this->_variantProps,piVar11);
              this_04 = ::std::get<0ul,tinyusdz::Path,tinyusdz::Property>
                                  ((pair<tinyusdz::Path,_tinyusdz::Property> *)
                                   prop_name.field_2._8_8_);
              psVar7 = Path::prop_part_abi_cxx11_(this_04);
              ::std::__cxx11::string::string((string *)&vs,(string *)psVar7);
              ptVar9 = ::std::get<1ul,tinyusdz::Path,tinyusdz::Property>
                                 ((pair<tinyusdz::Path,_tinyusdz::Property> *)
                                  prop_name.field_2._8_8_);
              this_05 = PrimSpec::props_abi_cxx11_((PrimSpec *)&__range3);
              this_06 = ::std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                        ::operator[](this_05,(key_type *)&vs);
              Property::operator=(this_06,ptVar9);
              ::std::__cxx11::string::~string((string *)&vs);
              __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
              operator++(&__end3);
            }
            pmVar13 = PrimSpec::variantSets_abi_cxx11_(parentPrimSpec);
            pmVar14 = ::std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>_>_>
                      ::operator[](pmVar13,(key_type *)((long)&variantName.field_2 + 8));
            uVar15 = ::std::__cxx11::string::empty();
            if ((uVar15 & 1) != 0) {
              ::std::__cxx11::string::operator=
                        ((string *)pmVar14,(string *)(variantName.field_2._M_local_buf + 8));
            }
            pmVar17 = ::std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>_>
                      ::operator[](&pmVar14->variantSet,
                                   (key_type *)
                                   &variant._asset_search_paths.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
            PrimSpec::operator=(pmVar17,(PrimSpec *)&__range3);
            bVar1 = false;
LAB_001e1652:
            PrimSpec::~PrimSpec((PrimSpec *)&__range3);
            ::std::__cxx11::string::~string
                      ((string *)
                       &variant._asset_search_paths.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            ::std::__cxx11::string::~string((string *)(variantName.field_2._M_local_buf + 8));
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream(local_1040);
            poVar2 = ::std::operator<<((ostream *)local_1040,"[error]");
            poVar2 = ::std::operator<<(poVar2,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                      );
            poVar2 = ::std::operator<<(poVar2,":");
            poVar2 = ::std::operator<<(poVar2,"ReconstructPrimSpecRecursively");
            poVar2 = ::std::operator<<(poVar2,"():");
            poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xe25);
            ::std::operator<<(poVar2," ");
            poVar2 = ::std::operator<<((ostream *)local_1040,"Invalid variant element_name.");
            ::std::operator<<(poVar2,"\n");
            ::std::__cxx11::ostringstream::str();
            PushError(this,(string *)((long)&variantSetName.field_2 + 8));
            ::std::__cxx11::string::~string((string *)(variantSetName.field_2._M_local_buf + 8));
            this_local._7_1_ = 0;
            bVar1 = true;
            ::std::__cxx11::ostringstream::~ostringstream(local_1040);
          }
          ::std::
          array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
          ::~array((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
                    *)local_ec8);
          if (!bVar1) goto LAB_001e1694;
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(local_e68);
          poVar2 = ::std::operator<<((ostream *)local_e68,"[error]");
          poVar2 = ::std::operator<<(poVar2,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                    );
          poVar2 = ::std::operator<<(poVar2,":");
          poVar2 = ::std::operator<<(poVar2,"ReconstructPrimSpecRecursively");
          poVar2 = ::std::operator<<(poVar2,"():");
          poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xe20);
          ::std::operator<<(poVar2," ");
          poVar2 = ::std::operator<<((ostream *)local_e68,
                                     "Corrupted Crate. VariantAttribute is not the child of VariantPrim."
                                    );
          ::std::operator<<(poVar2,"\n");
          ::std::__cxx11::ostringstream::str();
          PushError(this,(string *)&toks.field_0x38);
          ::std::__cxx11::string::~string((string *)&toks.field_0x38);
          this_local._7_1_ = 0;
          ::std::__cxx11::ostringstream::~ostringstream(local_e68);
        }
      }
    }
  }
  else {
    this_local._7_1_ = 0;
  }
LAB_001e1f07:
  nonstd::optional_lite::optional<tinyusdz::PrimSpec>::~optional
            ((optional<tinyusdz::PrimSpec> *)local_9a0);
LAB_001e1f13:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool USDCReader::Impl::ReconstructPrimSpecRecursively(
    int parent, int current, PrimSpec *parentPrimSpec, int level,
    const PathIndexToSpecIndexMap &psmap, Layer *layer) {
  if (level > int32_t(_config.kMaxPrimNestLevel)) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "PrimSpec hierarchy is too deep.");
  }

  DCOUT("ReconstructPrimRecursively: parent = "
        << std::to_string(parent) << ", current = " << current
        << ", level = " << std::to_string(level));

  if ((current < 0) || (current >= int(_nodes.size()))) {
    PUSH_ERROR("Invalid current node id: " + std::to_string(current) +
               ". Must be in range [0, " + std::to_string(_nodes.size()) + ")");
    return false;
  }

  // TODO: Refactor

  // null : parent node is Property or other Spec type.
  // non-null : parent node is PrimSpec
  PrimSpec *currPrimSpecPtr = nullptr;
  nonstd::optional<PrimSpec> primspec;

  // Assume parent node is already processed.
  bool is_parent_variant = _variantPrims.count(parent);

  if (!ReconstructPrimSpecNode(parent, current, level, is_parent_variant, psmap,
                           layer, &primspec)) {
    return false;
  }

  if (primspec) {
    currPrimSpecPtr = &(primspec.value());
  }

  {
    const crate::CrateReader::Node &node = _nodes[size_t(current)];
    DCOUT("node.Children.size = " << node.GetChildren().size());
    for (size_t i = 0; i < node.GetChildren().size(); i++) {
      DCOUT("Reconstuct Prim children: " << i << " / "
                                         << node.GetChildren().size());
      if (!ReconstructPrimSpecRecursively(current, int(node.GetChildren()[i]),
                                      currPrimSpecPtr, level + 1, psmap, layer)) {
        return false;
      }
      DCOUT("DONE Reconstuct PrimSpec children: " << i << " / "
                                              << node.GetChildren().size());
    }
  }

  //
  // Reonstruct variant
  //
  DCOUT(fmt::format("parent {}, current {}", parent, current));

  DCOUT(fmt::format("  has variant properties {}, has variant children {}",
    _variantPropChildren.count(current),
    _variantPrimChildren.count(current)));

  if (_variantPropChildren.count(current)) {

    // - parentPrim
    //   - variantPrim(SpecTypeVariant) <- current
    //     - variant property(SpecTypeAttribute)

    //
    // `current` must be VariantPrim and `parentPrim` should exist
    //
    if (!_variantPrims.count(current)) {
      PUSH_ERROR_AND_RETURN("Internal error: variant attribute is not a child of VariantPrim.");
    }

    if (!parentPrimSpec) {
      PUSH_ERROR_AND_RETURN("Internal error: parentPrimSpec should exist.");
    }

    const Prim &variantPrim = _variantPrims.at(current);

    DCOUT("variant prim name: " << variantPrim.element_name());


    // element_name must be variant: "{variant=value}"
    if (!is_variantElementName(variantPrim.element_name())) {
      PUSH_ERROR_AND_RETURN("Corrupted Crate. VariantAttribute is not the child of VariantPrim.");
    }

    std::array<std::string, 2> toks;
    if (!tokenize_variantElement(variantPrim.element_name(), &toks)) {
      PUSH_ERROR_AND_RETURN("Invalid variant element_name.");
    }

    std::string variantSetName = toks[0];
    std::string variantName = toks[1];

    PrimSpec variant;

    for (const auto &item : _variantPropChildren.at(current)) {
      // item should exist in _variantProps.
      if (!_variantProps.count(item)) {
        PUSH_ERROR_AND_RETURN("Internal error: variant Property not found.");
      }
      const std::pair<Path, Property> &pp = _variantProps.at(item);

      std::string prop_name = std::get<0>(pp).prop_part();
      DCOUT(fmt::format("  node_index = {}, prop name {}", item, prop_name));

      variant.props()[prop_name] = std::get<1>(pp);
    }

    VariantSetSpec &vs = parentPrimSpec->variantSets()[variantSetName];

    if (vs.name.empty()) {
      vs.name = variantSetName;
    }
    vs.variantSet[variantName] = variant;

  }

  if (_variantPrimChildren.count(current)) {

    // - currentPrim <- current
    //   - variant Prim children

    if (!primspec) {
      PUSH_ERROR_AND_RETURN("Internal error: must be Prim.");
    }

    DCOUT(fmt::format("{} has variant PrimSpec ", primspec->name()));


    for (const auto &item : _variantPrimChildren.at(current)) {

      if (!_variantPrimSpecs.count(item)) {
        PUSH_ERROR_AND_RETURN("Internal error: variant Prim children not found.");
      }

      const PrimSpec &vp = _variantPrimSpecs.at(item);

      DCOUT(fmt::format("  variantPrim name {}", vp.name()));

      // element_name must be variant: "{variant=value}"
      if (!is_variantElementName(vp.name())) {
        PUSH_ERROR_AND_RETURN("Corrupted Crate. Variant Prim has invalid element_name.");
      }

      std::array<std::string, 2> toks;
      if (!tokenize_variantElement(vp.name(), &toks)) {
        PUSH_ERROR_AND_RETURN("Invalid variant element_name.");
      }

      std::string variantSetName = toks[0];
      std::string variantName = toks[1];

      VariantSetSpec &vs = primspec->variantSets()[variantSetName];

      if (vs.name.empty()) {
        vs.name = variantSetName;
      }
      vs.variantSet[variantName].metas() = vp.metas();
      DCOUT("# of primChildren = " << vp.children().size());
      vs.variantSet[variantName].children() = std::move(vp.children());

    }
  }

  if (parent == 0) {  // root prim
    if (primspec) {
      layer->primspecs()[primspec.value().name()] = std::move(primspec.value());
    }
  } else {
    if (_variantPrimSpecs.count(parent)) {
      // Add to variantPrim
      DCOUT("parent is variantPrim: " << parent);
      if (!primspec) {
        // FIXME: Validate current should be Prim.
        PUSH_WARN("parent is variantPrim, but current is not Prim.");
      } else {
        DCOUT("Adding prim to child...");
        PrimSpec &vps = _variantPrimSpecs.at(parent);
        vps.children().emplace_back(std::move(primspec.value()));
      }
    } else if (primspec && parentPrimSpec) {
      // Add to parent prim.
      parentPrimSpec->children().emplace_back(std::move(primspec.value()));
    }
  }

  return true;
}